

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derLEnc(octet *der,size_t len)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  size_t l;
  
  sVar2 = 1;
  uVar3 = len;
  if (0x7f < len) {
    do {
      sVar2 = sVar2 + 1;
      bVar1 = 0xff < uVar3;
      uVar3 = uVar3 >> 8;
    } while (bVar1);
  }
  if (der != (octet *)0x0) {
    if (len < 0x80) {
      *der = (octet)len;
    }
    else {
      *der = (byte)(sVar2 - 1) | 0x80;
      lVar4 = sVar2 - 1;
      while (lVar4 != 0) {
        der[lVar4] = (octet)len;
        len = len >> 8;
        lVar4 = lVar4 + -1;
      }
    }
  }
  return sVar2;
}

Assistant:

static size_t derLEnc(octet der[], size_t len)
{
	size_t l_count = 1;
	// определить длину кода
	{
		size_t l = len;
		// длинная форма (r | 128) || o_{r - 1} ||...|| o_0?
		if (l >= 128)
			for (; l; l >>= 8, ++l_count);
	}
	// кодировать
	if (der)
	{
		ASSERT(memIsValid(der, l_count));
		if (len < 128)
		{
			ASSERT(l_count == 1);
			der[0] = (octet)len;
		}
		else
		{
			size_t r = l_count - 1;
			ASSERT(r >= 1);
			der[0] = (octet)(r | 128);
			for (; r; der[r--] = (octet)len, len >>= 8);
			ASSERT(len == 0);
		}
	}
	return l_count;
}